

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

string * __thiscall Kuhn::Game::infoSetStr_abi_cxx11_(string *__return_storage_ptr__,Game *this)

{
  int iVar1;
  int iVar2;
  allocator local_19;
  Game *local_18;
  Game *this_local;
  
  iVar1 = this->mCurrentPlayer;
  iVar2 = this->mTurnNum;
  local_18 = this;
  this_local = (Game *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)(this->mInfoSets + iVar1),(long)(iVar2 + 1),
             &local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string Game::infoSetStr() const {
    return std::string((char *) mInfoSets[mCurrentPlayer], mTurnNum + 1);
}